

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpretdfd.c
# Opt level: O0

InterpretDFDResult
interpretDFD(uint32_t *DFD,InterpretedDFDChannel *R,InterpretedDFDChannel *G,
            InterpretedDFDChannel *B,InterpretedDFDChannel *A,uint32_t *wordBytes)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  InterpretDFDResult IVar7;
  InterpretDFDResult IVar8;
  InterpretDFDResult IVar9;
  InterpretDFDResult IVar10;
  uint uVar11;
  int iVar12;
  uint32_t uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  long in_RDI;
  uint *in_R8;
  uint *in_R9;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  uint32_t largerSize;
  InterpretedDFDChannel *sampleChannelPtr_1;
  uint32_t sampleChannel_1;
  uint32_t sampleByteLength;
  uint32_t sampleByteOffset_1;
  uint32_t sampleCounter_4;
  uint32_t currentByteLength;
  uint32_t currentByteOffset_1;
  uint32_t currentChannel_1;
  uint32_t offsetMask;
  InterpretedDFDChannel *sampleChannelPtr;
  uint32_t sampleChannel;
  uint32_t sampleBitLength;
  uint32_t sampleByteOffset;
  uint32_t sampleBitOffset;
  uint32_t sampleCounter_3;
  uint32_t currentBitLength;
  uint32_t currentByteOffset;
  uint32_t currentBitOffset;
  uint32_t currentChannel;
  _Bool isFloat_1;
  _Bool isSigned_1;
  uint32_t i_3;
  uint32_t sampleCounter_2;
  uint32_t sampleCounter_1;
  uint32_t length_1;
  uint32_t i_2;
  uint32_t largestSampleSize;
  uint32_t i_1;
  uint32_t maxVal;
  uint32_t sampleUpper;
  _Bool isNormalized;
  _Bool isFixed;
  _Bool isFloat;
  _Bool isSigned;
  uint32_t i;
  khr_df_model_e model;
  _Bool hasFixed;
  _Bool hasNormalized;
  _Bool hasFloat;
  _Bool hasSigned;
  uint32_t length;
  uint32_t offset;
  uint32_t sampleCounter;
  _Bool isDepthStencil;
  InterpretDFDResult result;
  int determinedEndianness;
  uint32_t numSamples;
  uint32_t *BDFDB;
  uint32_t local_10c;
  bool local_ee;
  bool local_ed;
  uint *local_e8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint *local_c0;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_80;
  uint32_t local_7c;
  uint local_78;
  int local_74;
  uint local_68;
  uint local_54;
  InterpretDFDResult local_4c;
  InterpretDFDResult local_4;
  
  lVar16 = in_RDI + 4;
  uVar5 = (*(uint *)(in_RDI + 8) >> 0x12) - 6 >> 2;
  if (uVar5 == 0) {
    local_4 = i_UNSUPPORTED_CHANNEL_TYPES;
  }
  else {
    bVar3 = false;
    local_4c = i_LITTLE_ENDIAN_FORMAT_BIT;
    bVar2 = false;
    in_RSI[1] = 0;
    *in_RSI = 0;
    in_RDX[1] = 0;
    *in_RDX = 0;
    in_RCX[1] = 0;
    *in_RCX = 0;
    in_R8[1] = 0;
    *in_R8 = 0;
    if (((*(uint *)(in_RDI + 0x14) & 0xffffff00) == 0) && (*(int *)(in_RDI + 0x18) == 0)) {
      for (local_54 = 0; local_54 < uVar5; local_54 = local_54 + 1) {
        uVar6 = *(uint *)(lVar16 + (ulong)(local_54 * 4 + 6) * 4);
        if (((uVar6 & 7) != 0) ||
           (((uVar6 & 0xffff) +
             (*(uint *)(lVar16 + (ulong)(local_54 * 4 + 6) * 4) >> 0x10 & 0xff) + 1 & 7) != 0)) {
          local_4c = i_PACKED_FORMAT_BIT;
          break;
        }
      }
      bVar20 = false;
      bVar22 = false;
      bVar23 = false;
      bVar21 = false;
      uVar6 = *(uint *)(in_RDI + 0xc) & 0xff;
      for (local_68 = 0; local_68 < uVar5; local_68 = local_68 + 1) {
        bVar18 = (*(uint *)(lVar16 + (ulong)(local_68 * 4 + 6) * 4) >> 0x18 & 0x40) != 0;
        bVar19 = (*(uint *)(lVar16 + (ulong)(local_68 * 4 + 6) * 4) >> 0x18 & 0x80) != 0;
        if (bVar19) {
          local_ee = *(float *)(lVar16 + (ulong)(local_68 * 4 + 9) * 4) != 1.0;
          local_ed = false;
        }
        else {
          uVar11 = *(uint *)(lVar16 + (ulong)(local_68 * 4 + 9) * 4);
          local_74 = 1 << ((byte)((uint)*(undefined4 *)(lVar16 + (ulong)(local_68 * 4 + 6) * 4) >>
                                 0x10) & 0x1f);
          if (!bVar18) {
            local_74 = local_74 << 1;
          }
          bVar17 = uVar11 < local_74 - 1U;
          local_ed = 1 < uVar11 && bVar17;
          local_ee = (1 >= uVar11 || !bVar17) && uVar11 != 1;
        }
        bVar20 = bVar20 || bVar18;
        bVar21 = bVar21 || local_ed;
        bVar22 = bVar22 || bVar19;
        if ((*(uint *)(lVar16 + (ulong)(local_68 * 4 + 6) * 4) >> 0x10 & 0xff) != 0) {
          bVar23 = bVar23 || local_ee;
        }
      }
      IVar7 = i_LITTLE_ENDIAN_FORMAT_BIT;
      if (bVar20) {
        IVar7 = i_SIGNED_FORMAT_BIT;
      }
      IVar8 = i_LITTLE_ENDIAN_FORMAT_BIT;
      if (bVar22) {
        IVar8 = i_FLOAT_FORMAT_BIT;
      }
      IVar9 = i_LITTLE_ENDIAN_FORMAT_BIT;
      if (bVar23) {
        IVar9 = i_NORMALIZED_FORMAT_BIT;
      }
      IVar10 = i_LITTLE_ENDIAN_FORMAT_BIT;
      if (bVar21) {
        IVar10 = i_FIXED_FORMAT_BIT;
      }
      IVar10 = IVar10 | IVar9 | IVar8 | IVar7 | local_4c;
      if (uVar6 == 2) {
        for (local_78 = 0; local_78 < uVar5; local_78 = local_78 + 1) {
          uVar11 = *(byte *)(in_RDI + 7 + (ulong)(local_78 * 4 + 6) * 4) & 0xf;
          if (2 < uVar11) {
            if (uVar11 - 0xd < 2) {
              bVar2 = true;
            }
            else if (uVar11 != 0xf) {
              return i_UNSUPPORTED_CHANNEL_TYPES;
            }
          }
        }
        local_7c = 0;
        for (local_80 = 0; local_80 < uVar5; local_80 = local_80 + 1) {
          uVar11 = (*(uint *)(lVar16 + (ulong)(local_80 * 4 + 6) * 4) >> 0x10 & 0xff) + 1;
          if (local_7c < uVar11) {
            local_7c = uVar11;
          }
        }
        iVar12 = 1;
        if (local_4c != i_LITTLE_ENDIAN_FORMAT_BIT) {
          iVar12 = 4;
        }
        uVar13 = bit_ceil(local_7c);
        *in_R9 = iVar12 * uVar13 >> 3;
        local_4c = IVar10 | (i_YUVSDA_FORMAT_BIT|i_COMPRESSED_FORMAT_BIT|i_NORMALIZED_FORMAT_BIT);
      }
      else {
        local_4c = IVar10;
        if ((*(uint *)(in_RDI + 0xc) & 0xff) == 1) {
          if ((*(uint *)(in_RDI + 0xc) >> 0x10 & 0xff) == 2) {
            local_4c = IVar10 | i_SRGB_FORMAT_BIT;
          }
          for (local_88 = 0; local_88 < uVar5; local_88 = local_88 + 1) {
            if (*(int *)(lVar16 + (ulong)(local_88 * 4 + 7) * 4) != 0) {
              return i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
            }
          }
        }
      }
      if ((uVar6 == 1) || (uVar6 == 2)) {
        for (local_8c = 0; local_8c < uVar5; local_8c = local_8c + 1) {
          bVar4 = *(byte *)(in_RDI + 7 + (ulong)(local_8c * 4 + 6) * 4) & 0xf;
          if (bVar4 == 0xd || bVar4 == 0xe) {
            bVar2 = true;
          }
        }
        if (!bVar2) {
          for (local_90 = 0; local_90 < uVar5; local_90 = local_90 + 1) {
            if (((*(uint *)(lVar16 + (ulong)(local_90 * 4 + 6) * 4) >> 0x18 & 0x40) != 0) != bVar20)
            {
              return i_UNSUPPORTED_MIXED_CHANNELS;
            }
            if (((*(uint *)(lVar16 + (ulong)(local_90 * 4 + 6) * 4) >> 0x18 & 0x80) != 0) != bVar22)
            {
              return i_UNSUPPORTED_MIXED_CHANNELS;
            }
          }
        }
        if ((local_4c & i_PACKED_FORMAT_BIT) == i_LITTLE_ENDIAN_FORMAT_BIT) {
          local_c8 = 0xffffffff;
          local_cc = 0;
          local_d0 = 0;
          for (local_d4 = 0; local_d4 < uVar5; local_d4 = local_d4 + 1) {
            uVar11 = (uint)(*(ushort *)(lVar16 + (ulong)(local_d4 * 4 + 6) * 4) >> 3);
            uVar14 = *(byte *)(in_RDI + 6 + (ulong)(local_d4 * 4 + 6) * 4) + 1 >> 3;
            bVar4 = *(byte *)(in_RDI + 7 + (ulong)(local_d4 * 4 + 6) * 4);
            uVar15 = bVar4 & 0xf;
            local_e8 = in_RSI;
            switch(uVar15) {
            case 0:
              break;
            case 1:
              local_e8 = in_RDX;
              break;
            case 2:
              local_e8 = in_RCX;
              break;
            default:
              return i_UNSUPPORTED_CHANNEL_TYPES;
            case 0xd:
              local_e8 = in_RDX;
              break;
            case 0xe:
              break;
            case 0xf:
              local_e8 = in_R8;
            }
            if (uVar15 == local_c8) {
              if (uVar11 == local_cc - 1) {
                if ((bVar3) && ((local_4c & i_BIG_ENDIAN_FORMAT_BIT) == i_LITTLE_ENDIAN_FORMAT_BIT))
                {
                  return i_UNSUPPORTED_ERROR_BIT;
                }
                local_4c = local_4c | i_BIG_ENDIAN_FORMAT_BIT;
                *local_e8 = uVar11;
              }
              else {
                if (uVar11 != local_cc + local_d0) {
                  return i_UNSUPPORTED_ERROR_BIT;
                }
                if ((bVar3) && ((local_4c & i_BIG_ENDIAN_FORMAT_BIT) != i_LITTLE_ENDIAN_FORMAT_BIT))
                {
                  return i_UNSUPPORTED_ERROR_BIT;
                }
              }
              bVar3 = true;
              local_e8[1] = uVar14 + local_e8[1];
              *in_R9 = local_e8[1];
            }
            else {
              if (local_e8[1] != 0) {
                if ((uVar6 != 2) || ((bVar4 & 0xf) != 0)) {
                  return i_UNSUPPORTED_ERROR_BIT;
                }
                if ((local_e8 == in_RSI) && (local_e8 = in_R8, in_R8[1] != 0)) {
                  return i_UNSUPPORTED_CHANNEL_TYPES;
                }
              }
              *local_e8 = uVar11;
              local_e8[1] = uVar14;
              *in_R9 = uVar14;
              local_c8 = uVar15;
            }
            local_d0 = uVar14;
            local_cc = uVar11;
          }
        }
        else {
          local_98 = 0xffffffff;
          local_9c = 0;
          local_a0 = 0;
          local_a4 = 0;
          *in_R9 = *(uint *)(in_RDI + 0x14) & 0xff;
          for (local_a8 = 0; local_a8 < uVar5; local_a8 = local_a8 + 1) {
            uVar1 = *(ushort *)(lVar16 + (ulong)(local_a8 * 4 + 6) * 4);
            uVar11 = *(byte *)(in_RDI + 6 + (ulong)(local_a8 * 4 + 6) * 4) + 1;
            bVar4 = *(byte *)(in_RDI + 7 + (ulong)(local_a8 * 4 + 6) * 4);
            uVar14 = bVar4 & 0xf;
            local_c0 = in_RSI;
            switch(uVar14) {
            case 0:
              break;
            case 1:
              local_c0 = in_RDX;
              break;
            case 2:
              local_c0 = in_RCX;
              break;
            default:
              return i_UNSUPPORTED_CHANNEL_TYPES;
            case 0xd:
              local_c0 = in_RDX;
              break;
            case 0xe:
              break;
            case 0xf:
              local_c0 = in_R8;
            }
            if (uVar14 == local_98) {
              if ((((uint)(uVar1 >> 3) != local_a0 - 1) || ((local_9c + local_a4 & 7) != 0)) ||
                 ((uVar1 & 7) != 0)) {
                return i_UNSUPPORTED_ERROR_BIT;
              }
              local_4c = local_4c | i_BIG_ENDIAN_FORMAT_BIT;
              local_c0[1] = uVar11 + local_c0[1];
            }
            else {
              if (local_c0[1] != 0) {
                if ((uVar6 != 2) || ((bVar4 & 0xf) != 0)) {
                  return i_UNSUPPORTED_ERROR_BIT;
                }
                if ((local_c0 == in_RSI) && (local_c0 = in_R8, in_R8[1] != 0)) {
                  return i_UNSUPPORTED_CHANNEL_TYPES;
                }
              }
              *local_c0 = (uint)uVar1;
              local_c0[1] = uVar11;
              local_98 = uVar14;
            }
            local_a4 = uVar11;
            local_a0 = (uint)(uVar1 >> 3);
            local_9c = (uint)uVar1;
          }
          if ((local_4c & i_BIG_ENDIAN_FORMAT_BIT) != i_LITTLE_ENDIAN_FORMAT_BIT) {
            uVar5 = (*in_R9 - 1) * 8;
            *in_RSI = uVar5 ^ *in_RSI;
            *in_RDX = uVar5 ^ *in_RDX;
            *in_RCX = uVar5 ^ *in_RCX;
            *in_R8 = uVar5 ^ *in_R8;
          }
        }
        if (bVar2) {
          if (in_RDX[1] < in_RSI[1]) {
            local_10c = in_RSI[1];
          }
          else {
            local_10c = in_RDX[1];
          }
          uVar13 = bit_ceil(local_10c);
          *in_R9 = uVar13;
        }
        local_4 = local_4c;
      }
      else {
        local_4 = i_UNSUPPORTED_CHANNEL_TYPES;
      }
    }
    else {
      local_4 = i_UNSUPPORTED_MULTIPLE_PLANES;
    }
  }
  return local_4;
}

Assistant:

enum InterpretDFDResult interpretDFD(const uint32_t *DFD,
                                     InterpretedDFDChannel *R,
                                     InterpretedDFDChannel *G,
                                     InterpretedDFDChannel *B,
                                     InterpretedDFDChannel *A,
                                     uint32_t *wordBytes)
{
    /* DFD points to the whole descriptor, not the basic descriptor block. */
    /* Make everything else relative to the basic descriptor block. */
    const uint32_t *BDFDB = DFD+1;

    uint32_t numSamples = KHR_DFDSAMPLECOUNT(BDFDB);
    if (numSamples == 0)
        return i_UNSUPPORTED_CHANNEL_TYPES;

    int determinedEndianness = 0;
    enum InterpretDFDResult result = 0; /* Build this up incrementally. */

    bool isDepthStencil = false;

    /* Clear these so following code doesn't get confused. */
    R->offset = R->size = 0;
    G->offset = G->size = 0;
    B->offset = B->size = 0;
    A->offset = A->size = 0;

    /* First rule out the multiple planes case (trivially) */
    /* - that is, we check that only bytesPlane0 is non-zero. */
    /* This means we don't handle multi-plane YUV, even if the API could. */
    /* (We rely on KHR_DF_WORD_BYTESPLANE0..3 being the same and */
    /* KHR_DF_WORD_BYTESPLANE4..7 being the same as a short cut.) */
    if ((BDFDB[KHR_DF_WORD_BYTESPLANE0] & ~KHR_DF_MASK_BYTESPLANE0)
        || BDFDB[KHR_DF_WORD_BYTESPLANE4]) return i_UNSUPPORTED_MULTIPLE_PLANES;

    /* If this is a packed format, we work out our offsets differently. */
    /* We assume a packed format has channels that aren't byte-aligned. */
    /* If we have a format in which every channel is byte-aligned *and* packed, */
    /* we have the RGBA/ABGR ambiguity; we *probably* don't want the packed */
    /* version in this case, and if hardware has to pack it and swizzle, */
    /* that's up to the hardware to special-case. */
    for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
        uint32_t offset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET);
        uint32_t length = KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1;
        if ((offset & 0x7U) || ((offset + length) & 0x7U)) {
            result |= i_PACKED_FORMAT_BIT;
            /* Once we're packed, we're packed, no need to keep checking. */
            break;
        }
    }

    // Check data types.
    bool hasSigned = false;
    bool hasFloat = false;
    bool hasNormalized = false;
    bool hasFixed = false;
    khr_df_model_e model = KHR_DFDVAL(BDFDB, MODEL);

    // Note: We're ignoring 9995, which is weird and worth special-casing
    // rather than trying to generalise to all float formats.
    for (uint32_t i = 0; i < numSamples; ++i) {
        const bool isSigned = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
        const bool isFloat = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;

        // We define "unnormalized" as "sample_upper = 1" or "sample_upper = 1.0f".
        // We don't check whether any non-1 normalization value is correct
        // (i.e. set to the maximum bit value, and check min value) on
        // the assumption that we're looking at a format which *came* from
        // an API we can support.
        bool isFixed;
        bool isNormalized;
        if (isFloat) {
            isNormalized = *(float*) (void*) &BDFDB[KHR_DF_WORD_SAMPLESTART +
                    KHR_DF_WORD_SAMPLEWORDS * i +
                    KHR_DF_SAMPLEWORD_SAMPLEUPPER] != 1.0f;
            isFixed = false;
        } else {
            uint32_t sampleUpper = KHR_DFDSVAL(BDFDB, i, SAMPLEUPPER);
            uint32_t maxVal = 1U << KHR_DFDSVAL(BDFDB, i, BITLENGTH);
            if (!isSigned) maxVal <<= 1;
            maxVal--;
            isFixed = 1U < sampleUpper && sampleUpper < maxVal;
            isNormalized = !isFixed && sampleUpper != 1U;
        }
        hasSigned |= isSigned;
        hasFixed |= isFixed;
        hasFloat |= isFloat;
        // By our definition the normalizedness of a single bit channel (like in RGBA 5:5:5:1)
        // is ambiguous. Ignore these during normalized checks.
        if (KHR_DFDSVAL(BDFDB, i, BITLENGTH) > 0)
            hasNormalized |= isNormalized;
    }
    result |= hasSigned ? i_SIGNED_FORMAT_BIT : 0;
    result |= hasFloat ? i_FLOAT_FORMAT_BIT : 0;
    result |= hasNormalized ? i_NORMALIZED_FORMAT_BIT : 0;
    result |= hasFixed ? i_FIXED_FORMAT_BIT : 0;

    // Checks based on color model
    if (model == KHR_DF_MODEL_YUVSDA) {
        result |= i_NORMALIZED_FORMAT_BIT;
        result |= i_COMPRESSED_FORMAT_BIT;
        result |= i_YUVSDA_FORMAT_BIT;

        for (uint32_t i = 0; i < numSamples; ++i) {
            switch (KHR_DFDSVAL(BDFDB, i, CHANNELID)) {
            case KHR_DF_CHANNEL_YUVSDA_Y:
            case KHR_DF_CHANNEL_YUVSDA_U:
            case KHR_DF_CHANNEL_YUVSDA_V:
            case KHR_DF_CHANNEL_YUVSDA_A:
                break;
            case KHR_DF_CHANNEL_YUVSDA_DEPTH:
            case KHR_DF_CHANNEL_YUVSDA_STENCIL:
                isDepthStencil = true;
                break;
            default:
                return i_UNSUPPORTED_CHANNEL_TYPES;
            }
        }

        // Determine wordBytes
        uint32_t largestSampleSize = 0;
        for (uint32_t i = 0; i < numSamples; ++i) {
            uint32_t length = KHR_DFDSVAL(BDFDB, i, BITLENGTH) + 1;
            if (largestSampleSize < length)
                largestSampleSize = length;
        }
        *wordBytes = ((result & i_PACKED_FORMAT_BIT) ? 4 : 1) * bit_ceil(largestSampleSize) / 8;

    } else if (KHR_DFDVAL(BDFDB, MODEL) == KHR_DF_MODEL_RGBSDA) {
        /* Check if transfer is sRGB. */
        if (KHR_DFDVAL(BDFDB, TRANSFER) == KHR_DF_TRANSFER_SRGB) result |= i_SRGB_FORMAT_BIT;

        /* We only support samples at coordinate 0,0,0,0. */
        /* (We could confirm this from texel_block_dimensions in 1.2, but */
        /* the interpretation might change in later versions.) */
        for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
            if (KHR_DFDSVAL(BDFDB, sampleCounter, SAMPLEPOSITION_ALL))
                return i_UNSUPPORTED_MULTIPLE_SAMPLE_LOCATIONS;
        }
    }

    if (model == KHR_DF_MODEL_RGBSDA || model == KHR_DF_MODEL_YUVSDA) {
        /* The values of the DEPTH and STENCIL tokens are the same for */
        /* RGBSDA and YUVSDA. */
        /* For Depth/Stencil formats mixed channels are allowed */
        for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
            switch (KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID)) {
            case KHR_DF_CHANNEL_RGBSDA_DEPTH:
            case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                isDepthStencil = true;
                break;
            default:
                break;
            }
        }

        // Check for mixed channels
        if (!isDepthStencil) {
            for (uint32_t i = 0; i < numSamples; ++i) {
                const bool isSigned = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_SIGNED) != 0;
                const bool isFloat = (KHR_DFDSVAL(BDFDB, i, QUALIFIERS) & KHR_DF_SAMPLE_DATATYPE_FLOAT) != 0;

                if (isSigned != hasSigned)
                    return i_UNSUPPORTED_MIXED_CHANNELS;
                if (isFloat != hasFloat)
                    return i_UNSUPPORTED_MIXED_CHANNELS;

                // Note: We don't check for inconsistent normalization, because
                // channels composed of multiple samples will have 0 in the
                // lower/upper range. Single bit channels are also ambiguous.
                // This heuristic should handle 64-bit integers, too.
            }
        }

        /* This all relies on the channel id values for RGB being equal to */
        /* those for YUV. */

        /* Remember: the canonical ordering of samples is to start with */
        /* the lowest bit of the channel/location which touches bit 0 of */
        /* the data, when the latter is concatenated in little-endian order, */
        /* and then progress until all the bits of that channel/location */
        /* have been processed. Multiple channels sharing the same source */
        /* bits are processed in channel ID order. (I should clarify this */
        /* for partially-shared data, but it doesn't really matter so long */
        /* as everything is consecutive, except to make things canonical.) */
        /* Note: For standard formats we could determine big/little-endianness */
        /* simply from whether the first sample starts in bit 0; technically */
        /* it's possible to have a format with unaligned channels wherein the */
        /* first channel starts at bit 0 and is one byte, yet other channels */
        /* take more bytes or aren't aligned (e.g. D24S8), but this should be */
        /* irrelevant for the formats that we support. */
        if ((result & i_PACKED_FORMAT_BIT)) {
            /* A packed format. */
            uint32_t currentChannel = ~0U; /* Don't start matched. */
            uint32_t currentBitOffset = 0;
            uint32_t currentByteOffset = 0;
            uint32_t currentBitLength = 0;
            *wordBytes = (BDFDB[KHR_DF_WORD_BYTESPLANE0] & 0xFFU);
            for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
                uint32_t sampleBitOffset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET);
                uint32_t sampleByteOffset = sampleBitOffset >> 3U;
                /* The sample bitLength field stores the bit length - 1. */
                uint32_t sampleBitLength = KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1;
                uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID);
                InterpretedDFDChannel *sampleChannelPtr;
                switch (sampleChannel) {
                case KHR_DF_CHANNEL_RGBSDA_RED:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_GREEN:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_BLUE:
                    sampleChannelPtr = B;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_DEPTH:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_ALPHA:
                    sampleChannelPtr = A;
                    break;
                default:
                    return i_UNSUPPORTED_CHANNEL_TYPES;
                }
                if (sampleChannel == currentChannel) {
                    /* Continuation of the same channel. */
                    /* Since a big (>32-bit) channel isn't "packed", */
                    /* this should only happen in big-endian, or if */
                    /* we have a wacky format that we won't support. */
                    if (sampleByteOffset == currentByteOffset - 1U && /* One byte earlier */
                        ((currentBitOffset + currentBitLength) & 7U) == 0 && /* Already at the end of a byte */
                        (sampleBitOffset & 7U) == 0) { /* Start at the beginning of the byte */
                        /* All is good, continue big-endian. */
                        /* N.B. We shouldn't be here if we decided we were little-endian, */
                        /* so we don't bother to check that disagreement. */
                        result |= i_BIG_ENDIAN_FORMAT_BIT;
                        determinedEndianness = 1;
                    } else {
                        /* Oh dear. */
                        /* We could be little-endian, but not with any standard format. */
                        /* More likely we've got something weird that we can't support. */
                        return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                    }
                    /* Remember where we are. */
                    currentBitOffset = sampleBitOffset;
                    currentByteOffset = sampleByteOffset;
                    currentBitLength = sampleBitLength;
                    /* Accumulate the bit length. */
                    sampleChannelPtr->size += sampleBitLength;
                } else {
                    /* Everything is new. Hopefully. */
                    currentChannel = sampleChannel;
                    currentBitOffset = sampleBitOffset;
                    currentByteOffset = sampleByteOffset;
                    currentBitLength = sampleBitLength;
                    if (sampleChannelPtr->size) {
                        if (model == KHR_DF_MODEL_YUVSDA && sampleChannel == KHR_DF_CHANNEL_YUVSDA_Y) {
                            if (sampleChannelPtr == R) {
                                /* We've got another Y channel. Record details in A. */
                                if (A->size == 0) {
                                    sampleChannelPtr = A;
                                } else {
                                    /* Uh-oh, we've already got a second Y or an alpha channel. */
                                    return i_UNSUPPORTED_CHANNEL_TYPES;
                                }
                            }
                        } else {
                          /* Uh-oh, we've seen this channel before. */
                          return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                    }
                    /* For now, record the bit offset in little-endian terms, */
                    /* because we may not know to reverse it yet. */
                    sampleChannelPtr->offset = sampleBitOffset;
                    sampleChannelPtr->size = sampleBitLength;
                }
            }
            if ((result & i_BIG_ENDIAN_FORMAT_BIT)) {
                /* Our bit offsets to bit 0 of each channel are in little-endian terms. */
                /* We need to do a byte swap to work out where they should be. */
                /* We assume, for sanity, that byte sizes are a power of two for this. */
                uint32_t offsetMask = (*wordBytes - 1U) << 3U;
                R->offset ^= offsetMask;
                G->offset ^= offsetMask;
                B->offset ^= offsetMask;
                A->offset ^= offsetMask;
            }
        } else {
            /* Not a packed format. */
            /* Everything is byte-aligned. */
            /* Question is whether there multiple samples per channel. */
            uint32_t currentChannel = ~0U; /* Don't start matched. */
            uint32_t currentByteOffset = 0;
            uint32_t currentByteLength = 0;
            for (uint32_t sampleCounter = 0; sampleCounter < numSamples; ++sampleCounter) {
                uint32_t sampleByteOffset = KHR_DFDSVAL(BDFDB, sampleCounter, BITOFFSET) >> 3U;
                uint32_t sampleByteLength = (KHR_DFDSVAL(BDFDB, sampleCounter, BITLENGTH) + 1) >> 3U;
                uint32_t sampleChannel = KHR_DFDSVAL(BDFDB, sampleCounter, CHANNELID);
                InterpretedDFDChannel *sampleChannelPtr;
                switch (sampleChannel) {
                case KHR_DF_CHANNEL_RGBSDA_RED:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_GREEN:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_BLUE:
                    sampleChannelPtr = B;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_DEPTH:
                    sampleChannelPtr = R;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_STENCIL:
                    sampleChannelPtr = G;
                    break;
                case KHR_DF_CHANNEL_RGBSDA_ALPHA:
                    sampleChannelPtr = A;
                    break;
                default:
                    return i_UNSUPPORTED_CHANNEL_TYPES;
                }
                if (sampleChannel == currentChannel) {
                    /* Continuation of the same channel. */
                    /* Either big-endian, or little-endian with a very large channel. */
                    if (sampleByteOffset == currentByteOffset - 1) { /* One byte earlier */
                        if (determinedEndianness && !(result & i_BIG_ENDIAN_FORMAT_BIT)) {
                            return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                        /* All is good, continue big-endian. */
                        result |= i_BIG_ENDIAN_FORMAT_BIT;
                        determinedEndianness = 1;
                        /* Update the start */
                        sampleChannelPtr->offset = sampleByteOffset;
                    } else if (sampleByteOffset == currentByteOffset + currentByteLength) {
                        if (determinedEndianness && (result & i_BIG_ENDIAN_FORMAT_BIT)) {
                            return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                        /* All is good, continue little-endian. */
                        determinedEndianness = 1;
                    } else {
                        /* Oh dear. */
                        /* We could be little-endian, but not with any standard format. */
                        /* More likely we've got something weird that we can't support. */
                        return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                    }
                    /* Remember where we are. */
                    currentByteOffset = sampleByteOffset;
                    currentByteLength = sampleByteLength;
                    /* Accumulate the byte length. */
                    sampleChannelPtr->size += sampleByteLength;
                    /* Assume these are all the same. */
                    *wordBytes = sampleChannelPtr->size;
                } else {
                    /* Everything is new. Hopefully. */
                    currentChannel = sampleChannel;
                    currentByteOffset = sampleByteOffset;
                    currentByteLength = sampleByteLength;
                    if (sampleChannelPtr->size) {
                        if (model == KHR_DF_MODEL_YUVSDA && sampleChannel == KHR_DF_CHANNEL_YUVSDA_Y) {
                            if (sampleChannelPtr == R) {
                                /* We've got another Y channel. Record details in A. */
                                if (A->size == 0) {
                                    sampleChannelPtr = A;
                                } else {
                                    /* Uh-oh, we've already got a second Y or an alpha channel. */
                                    return i_UNSUPPORTED_CHANNEL_TYPES;
                                }
                            }
                        } else {
                          /* Uh-oh, we've seen this channel before. */
                          return i_UNSUPPORTED_NONTRIVIAL_ENDIANNESS;
                        }
                    }
                    /* For now, record the byte offset in little-endian terms, */
                    /* because we may not know to reverse it yet. */
                    sampleChannelPtr->offset = sampleByteOffset;
                    sampleChannelPtr->size = sampleByteLength;
                    /* Assume these are all the same. */
                    *wordBytes = sampleByteLength;
                }
            }
        }
    } else {
        return i_UNSUPPORTED_CHANNEL_TYPES;
    }

    if (isDepthStencil) {
        /* For Depth/Stencil formats wordBytes is determined by the required alignment of */
        /* the larger channel. */
        uint32_t largerSize = R->size > G->size ? R->size : G->size;
        *wordBytes = bit_ceil(largerSize);
    }

    return result;
}